

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O1

void __thiscall
cppcms::application_specific_pool::_legacy_pool_policy::put
          (_legacy_pool_policy *this,application *app)

{
  pointer ppaVar1;
  size_t sVar2;
  
  if (app != (application *)0x0) {
    if (this->limit_ <= this->size_) {
      (*app->_vptr_application[1])(app);
    }
    ppaVar1 = (this->apps_).
              super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar2 = this->size_;
    this->size_ = sVar2 + 1;
    ppaVar1[sVar2] = app;
  }
  return;
}

Assistant:

virtual void put(application *app)
	{
		if(!app)
			return;
		// must never heppen start
		if(size_ >= limit_)
			delete app;
		// must never happend end
		apps_[size_++] = app;
	}